

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O0

ostream * tcu::operator<<(ostream *stream,RGBA c)

{
  int iVar1;
  ostream *poVar2;
  ostream *stream_local;
  RGBA c_local;
  
  stream_local._4_4_ = c.m_value;
  poVar2 = std::operator<<(stream,"RGBA(");
  iVar1 = RGBA::getRed((RGBA *)((long)&stream_local + 4));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", ");
  iVar1 = RGBA::getGreen((RGBA *)((long)&stream_local + 4));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", ");
  iVar1 = RGBA::getBlue((RGBA *)((long)&stream_local + 4));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", ");
  iVar1 = RGBA::getAlpha((RGBA *)((long)&stream_local + 4));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,")");
  return poVar2;
}

Assistant:

inline std::ostream& operator<< (std::ostream& stream, RGBA c)
{
	return stream << "RGBA(" << c.getRed() << ", " << c.getGreen() << ", " << c.getBlue() << ", " << c.getAlpha() << ")";
}